

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::SolveSystemPhi
          (TPZDohrSubstruct<std::complex<long_double>_> *this)

{
  complex<long_double> value;
  int64_t iVar1;
  long lVar2;
  complex<long_double> *this_00;
  TPZFMatrix<std::complex<long_double>_> *this_01;
  long in_RDI;
  TPZFMatrix<std::complex<long_double>_> Lambda_star;
  TPZFMatrix<std::complex<long_double>_> I_lambda;
  int i;
  int ncoarse;
  undefined2 in_stack_fffffffffffffe50;
  undefined6 in_stack_fffffffffffffe52;
  undefined2 in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe62;
  int64_t in_stack_fffffffffffffe68;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffe70;
  undefined1 *puVar3;
  undefined8 in_stack_fffffffffffffe98;
  int64_t in_stack_fffffffffffffed0;
  int64_t in_stack_fffffffffffffed8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffffee0;
  int64_t in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff3c;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff40;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff48;
  TPZMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff50;
  undefined1 local_a0 [80];
  TPZDohrSubstruct<std::complex<long_double>_> *in_stack_ffffffffffffffb0;
  int local_10;
  
  iVar1 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  lVar2 = (long)(int)iVar1;
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  puVar3 = local_a0;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  TPZFMatrix<std::complex<long_double>_>::Zero
            ((TPZFMatrix<std::complex<long_double>_> *)
             CONCAT62(in_stack_fffffffffffffe52,in_stack_fffffffffffffe50));
  for (local_10 = 0; local_10 < (int)iVar1; local_10 = local_10 + 1) {
    this_00 = TPZFMatrix<std::complex<long_double>_>::operator()
                        (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                         CONCAT62(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60));
    std::complex<long_double>::operator=(this_00,(longdouble)1);
  }
  this_01 = (TPZFMatrix<std::complex<long_double>_> *)
            TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  TPZStepSolver<std::complex<long_double>_>::Solve
            ((TPZStepSolver<std::complex<long_double>_> *)
             I_lambda.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix._24_8_,
             (TPZFMatrix<std::complex<long_double>_> *)
             I_lambda.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fCol,
             (TPZFMatrix<std::complex<long_double>_> *)
             I_lambda.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.fRow,
             (TPZFMatrix<std::complex<long_double>_> *)
             I_lambda.super_TPZMatrix<std::complex<long_double>_>.super_TPZBaseMatrix.
             super_TPZSavable._vptr_TPZSavable);
  TPZFMatrix<std::complex<long_double>_>::Resize
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZMatrix<std::complex<long_double>_>::Multiply
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff3c);
  std::complex<long_double>::complex
            ((complex<long_double> *)&stack0xfffffffffffffe98,-(longdouble)1,(longdouble)0);
  value._M_value._8_8_ = lVar2;
  value._M_value._0_8_ = in_RDI;
  value._M_value._16_8_ = puVar3;
  value._M_value._24_8_ = in_stack_fffffffffffffe98;
  TPZFMatrix<std::complex<long_double>_>::operator*=(this_01,value);
  ComputeCoarseStiffness(in_stack_ffffffffffffffb0);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix
            ((TPZFMatrix<std::complex<long_double>_> *)0x200dfa0);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix
            ((TPZFMatrix<std::complex<long_double>_> *)0x200dfad);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseIndex.NElements();
	int i;
	//  I_star.Print("fIStar = ",out,EMathematicaInput);
	//  std::cout << "Nci: ";
	//  std::cout << ncoarse;// << endl;
	//  std::cout << endl;
	//Constructing I_lambda
	TPZFMatrix<TVar> I_lambda(ncoarse+fNullPivots.Rows(),ncoarse);
	I_lambda.Zero();
	for (i=0;i<ncoarse;i++) {
		I_lambda(i,i)=1;
	}
	//  I_lambda.Print("ILambda = ",out,EMathematicaInput);
	
	//Obtaining lambda_star
	TPZFMatrix<TVar> Lambda_star(ncoarse+fNullPivots.Rows(),ncoarse);
	//  temp1->Print("temp1 = ",out,EMathematicaInput);
	//  out.flush();
	finv.Solve(I_lambda, Lambda_star);
	
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		Lambda_star.Print("matrix lambda star",sout );
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//Obtaining Phi
	/** Acho q posso comentar essas duas linhas abaixo, pq naum tou vendo aplicacao pra temp2 */
	/*
	 TPZFMatrix<TVar> temp2(fNEquations,ncoarse);
	 C_star.MultAdd(Lambda_star,Lambda_star,temp2,-1,0,1,1);
	 */
	fPhiC.Resize(fNEquations,ncoarse);
	fKeC_star.Multiply(Lambda_star,fPhiC);
	fPhiC *= -1.;
	ComputeCoarseStiffness();
	//  fPhiC.Print("PhiC = ",out,EMathematicaInput);
	//  fC.Print("Ci = ",std::cout,EMathematicaInput);
}